

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

Generator * kratos::MergeWireAssignmentsVisitor::get_parent(StmtBlock *block)

{
  IRNodeKind IVar1;
  int iVar2;
  undefined4 extraout_var;
  Generator *pGVar4;
  StmtException *this;
  int iVar5;
  bool bVar6;
  initializer_list<kratos::IRNode_*> __l;
  StmtBlock *local_80;
  string local_78;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_58;
  StmtBlock *local_40;
  allocator_type local_31;
  StmtBlock *pSVar3;
  
  iVar5 = 9999;
  pGVar4 = (Generator *)0x0;
  local_40 = block;
  do {
    iVar2 = (*(block->super_Stmt).super_IRNode._vptr_IRNode[4])(block);
    pSVar3 = (StmtBlock *)CONCAT44(extraout_var,iVar2);
    IVar1 = (pSVar3->super_Stmt).super_IRNode.ast_node_type_;
    if (IVar1 == GeneratorKind) {
      pGVar4 = (Generator *)__dynamic_cast(pSVar3,&IRNode::typeinfo,&Generator::typeinfo,0);
      pSVar3 = block;
    }
    bVar6 = iVar5 != 0;
    iVar5 = iVar5 + -1;
  } while ((IVar1 != GeneratorKind) && (block = pSVar3, bVar6));
  if (pGVar4 == (Generator *)0x0) {
    this = (StmtException *)__cxa_allocate_exception(0x10);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Cannot find parent for the statement block","");
    local_80 = local_40;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_80;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_58,__l,&local_31);
    StmtException::StmtException(this,&local_78,&local_58);
    __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
  return pGVar4;
}

Assistant:

static Generator* get_parent(StmtBlock* block) {
        Generator* result = nullptr;
        IRNode* node = block;
        for (uint32_t i = 0; i < 10000u; i++) {
            auto* p = node->parent();
            if (p->ir_node_kind() == IRNodeKind::GeneratorKind) {
                result = dynamic_cast<Generator*>(p);
                break;
            }
            node = p;
        }
        if (!result) {
            throw StmtException("Cannot find parent for the statement block", {block});
        }
        return result;
    }